

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugAranges.cpp
# Opt level: O2

void __thiscall
llvm::DWARFDebugAranges::extract(DWARFDebugAranges *this,DataExtractor DebugArangesData)

{
  pointer pDVar1;
  bool bVar2;
  Descriptor *Desc;
  pointer pDVar3;
  pair<llvm::detail::DenseSetImpl<unsigned_long,_llvm::DenseMap<unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>,_llvm::DenseMapInfo<unsigned_long>_>::Iterator,_bool>
  local_88;
  undefined1 local_70 [8];
  DWARFDebugArangeSet Set;
  uint64_t Offset;
  uint64_t CUOffset;
  
  if (DebugArangesData.Data.Length != 0) {
    Set.ArangeDescriptors.
    super__Vector_base<llvm::DWARFDebugArangeSet::Descriptor,_std::allocator<llvm::DWARFDebugArangeSet::Descriptor>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    DWARFDebugArangeSet::DWARFDebugArangeSet((DWARFDebugArangeSet *)local_70);
    while( true ) {
      bVar2 = DWARFDebugArangeSet::extract
                        ((DWARFDebugArangeSet *)local_70,DebugArangesData,
                         (uint64_t *)
                         &Set.ArangeDescriptors.
                          super__Vector_base<llvm::DWARFDebugArangeSet::Descriptor,_std::allocator<llvm::DWARFDebugArangeSet::Descriptor>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pDVar1 = Set.ArangeDescriptors.
               super__Vector_base<llvm::DWARFDebugArangeSet::Descriptor,_std::allocator<llvm::DWARFDebugArangeSet::Descriptor>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (!bVar2) break;
      Offset = (uint64_t)Set.Offset._4_4_;
      for (pDVar3 = (pointer)Set._16_8_; pDVar3 != pDVar1; pDVar3 = pDVar3 + 1) {
        appendRange(this,Offset,pDVar3->Address,pDVar3->Length + pDVar3->Address);
      }
      detail::
      DenseSetImpl<unsigned_long,_llvm::DenseMap<unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>,_llvm::DenseMapInfo<unsigned_long>_>
      ::insert(&local_88,
               &(this->ParsedCUOffsets).
                super_DenseSetImpl<unsigned_long,_llvm::DenseMap<unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>,_llvm::DenseMapInfo<unsigned_long>_>
               ,&Offset);
    }
    std::
    _Vector_base<llvm::DWARFDebugArangeSet::Descriptor,_std::allocator<llvm::DWARFDebugArangeSet::Descriptor>_>
    ::~_Vector_base((_Vector_base<llvm::DWARFDebugArangeSet::Descriptor,_std::allocator<llvm::DWARFDebugArangeSet::Descriptor>_>
                     *)&Set.HeaderData.Version);
  }
  return;
}

Assistant:

void DWARFDebugAranges::extract(DataExtractor DebugArangesData) {
  if (!DebugArangesData.isValidOffset(0))
    return;
  uint64_t Offset = 0;
  DWARFDebugArangeSet Set;

  while (Set.extract(DebugArangesData, &Offset)) {
    uint64_t CUOffset = Set.getCompileUnitDIEOffset();
    for (const auto &Desc : Set.descriptors()) {
      uint64_t LowPC = Desc.Address;
      uint64_t HighPC = Desc.getEndAddress();
      appendRange(CUOffset, LowPC, HighPC);
    }
    ParsedCUOffsets.insert(CUOffset);
  }
}